

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O0

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir
          (ExponentiallyDecayingReservoir *this,size_t size,double alpha,Clock *clock)

{
  int iVar1;
  undefined4 extraout_var;
  Clock *local_58;
  Clock *clock_local;
  double alpha_local;
  size_t size_local;
  ExponentiallyDecayingReservoir *this_local;
  
  Reservoir::Reservoir(&this->super_Reservoir);
  (this->super_Reservoir)._vptr_Reservoir =
       (_func_int **)&PTR__ExponentiallyDecayingReservoir_00190778;
  memset(&this->m_mutex,0,0x28);
  std::mutex::mutex(&this->m_mutex);
  std::atomic<long>::atomic(&this->m_count,0);
  local_58 = clock;
  if (clock == (Clock *)0x0) {
    local_58 = GetDefaultClock();
  }
  this->m_clock = local_58;
  iVar1 = (*this->m_clock->_vptr_Clock[1])();
  this->m_start = CONCAT44(extraout_var,iVar1);
  this->m_next_rescale_time = this->m_start + 0x3c;
  this->m_size = size;
  this->m_alpha = alpha;
  memset(&this->m_samples,0,0x30);
  std::
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  ::map(&this->m_samples);
  return;
}

Assistant:

ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir(std::size_t size, double alpha, Clock* clock)
    : m_mutex()
    , m_count(0)
    , m_clock(clock != nullptr ? clock : GetDefaultClock())
    , m_start(m_clock->now_as_time_t())
    , m_next_rescale_time(m_start + kRescalePeriod)
    , m_size(size)
    , m_alpha(alpha)
    , m_samples()
{}